

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O0

bool __thiscall
YAML::EmitterState::SetBoolLengthFormat(EmitterState *this,EMITTER_MANIP value,value scope)

{
  int in_ESI;
  value in_stack_00000040;
  EMITTER_MANIP in_stack_00000044;
  Setting<YAML::EMITTER_MANIP> *in_stack_00000048;
  EmitterState *in_stack_00000050;
  bool local_1;
  
  if (in_ESI == 0x13 || in_ESI == 0x14) {
    _Set<YAML::EMITTER_MANIP>
              (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000040);
  }
  local_1 = in_ESI == 0x13 || in_ESI == 0x14;
  return local_1;
}

Assistant:

bool EmitterState::SetBoolLengthFormat(EMITTER_MANIP value,
                                       FmtScope::value scope) {
  switch (value) {
    case LongBool:
    case ShortBool:
      _Set(m_boolLengthFmt, value, scope);
      return true;
    default:
      return false;
  }
}